

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O0

bool __thiscall
cmFileCopier::InstallSymlinkChain(cmFileCopier *this,string *fromFile,string *toFile)

{
  cmCommand *this_00;
  bool bVar1;
  __type _Var2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2e0;
  int local_2bc;
  string local_2b8;
  undefined1 local_298 [8];
  ostringstream e;
  undefined1 local_120 [8];
  string oldSymlinkTarget;
  undefined1 local_f8 [7];
  bool copy;
  string symlinkTarget;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 local_98 [8];
  string fromFilePath;
  undefined1 local_68 [8];
  string toFilePath;
  string newFromFile;
  string *toFile_local;
  string *fromFile_local;
  cmFileCopier *this_local;
  
  std::__cxx11::string::string((string *)(toFilePath.field_2._M_local_buf + 8));
  cmsys::SystemTools::GetFilenamePath((string *)local_68,toFile);
  do {
    bVar1 = cmsys::SystemTools::ReadSymlink(fromFile,(string *)((long)&toFilePath.field_2 + 8));
    if (!bVar1) {
      this_local._7_1_ = 1;
      local_2bc = 1;
      break;
    }
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)((long)&toFilePath.field_2 + 8));
    if (!bVar1) {
      cmsys::SystemTools::GetFilenamePath((string *)local_98,fromFile);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&symlinkTarget.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_98,
                     "/");
      std::operator+(&local_b8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&symlinkTarget.field_2 + 8),
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&toFilePath.field_2 + 8));
      std::__cxx11::string::operator=
                ((string *)(toFilePath.field_2._M_local_buf + 8),(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)(symlinkTarget.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_98);
    }
    cmsys::SystemTools::GetFilenameName
              ((string *)local_f8,(string *)((long)&toFilePath.field_2 + 8));
    oldSymlinkTarget.field_2._M_local_buf[0xf] = '\x01';
    if ((this->Always & 1U) == 0) {
      std::__cxx11::string::string((string *)local_120);
      bVar1 = cmsys::SystemTools::ReadSymlink(toFile,(string *)local_120);
      if ((bVar1) &&
         (_Var2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_f8,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_120), _Var2)) {
        oldSymlinkTarget.field_2._M_local_buf[0xf] = '\0';
      }
      std::__cxx11::string::~string((string *)local_120);
    }
    (*this->_vptr_cmFileCopier[4])
              (this,toFile,2,(ulong)((byte)oldSymlinkTarget.field_2._M_local_buf[0xf] & 1));
    if ((oldSymlinkTarget.field_2._M_local_buf[0xf] & 1U) == 0) {
LAB_00462026:
      std::__cxx11::string::operator=
                ((string *)fromFile,(string *)(toFilePath.field_2._M_local_buf + 8));
      std::operator+(&local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68,
                     "/");
      std::operator+(&local_2e0,&local_300,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_f8);
      std::__cxx11::string::operator=((string *)toFile,(string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_2e0);
      std::__cxx11::string::~string((string *)&local_300);
      local_2bc = 0;
    }
    else {
      cmsys::SystemTools::RemoveFile(toFile);
      cmsys::SystemTools::MakeDirectory((string *)local_68,(mode_t *)0x0);
      bVar1 = cmSystemTools::CreateSymlink((string *)local_f8,toFile,(string *)0x0);
      if (bVar1) goto LAB_00462026;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_298);
      poVar3 = std::operator<<((ostream *)local_298,this->Name);
      poVar3 = std::operator<<(poVar3," cannot create symlink \"");
      poVar3 = std::operator<<(poVar3,(string *)toFile);
      std::operator<<(poVar3,"\".");
      this_00 = &this->FileCommand->super_cmCommand;
      std::__cxx11::ostringstream::str();
      cmCommand::SetError(this_00,&local_2b8);
      std::__cxx11::string::~string((string *)&local_2b8);
      this_local._7_1_ = 0;
      local_2bc = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_298);
    }
    std::__cxx11::string::~string((string *)local_f8);
  } while (local_2bc == 0);
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(toFilePath.field_2._M_local_buf + 8));
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmFileCopier::InstallSymlinkChain(std::string& fromFile,
                                       std::string& toFile)
{
  std::string newFromFile;
  std::string toFilePath = cmSystemTools::GetFilenamePath(toFile);
  while (cmSystemTools::ReadSymlink(fromFile, newFromFile)) {
    if (!cmSystemTools::FileIsFullPath(newFromFile)) {
      std::string fromFilePath = cmSystemTools::GetFilenamePath(fromFile);
      newFromFile = fromFilePath + "/" + newFromFile;
    }

    std::string symlinkTarget = cmSystemTools::GetFilenameName(newFromFile);

    bool copy = true;
    if (!this->Always) {
      std::string oldSymlinkTarget;
      if (cmSystemTools::ReadSymlink(toFile, oldSymlinkTarget)) {
        if (symlinkTarget == oldSymlinkTarget) {
          copy = false;
        }
      }
    }

    this->ReportCopy(toFile, TypeLink, copy);

    if (copy) {
      cmSystemTools::RemoveFile(toFile);
      cmSystemTools::MakeDirectory(toFilePath);

      if (!cmSystemTools::CreateSymlink(symlinkTarget, toFile)) {
        std::ostringstream e;
        e << this->Name << " cannot create symlink \"" << toFile << "\".";
        this->FileCommand->SetError(e.str());
        return false;
      }
    }

    fromFile = newFromFile;
    toFile = toFilePath + "/" + symlinkTarget;
  }

  return true;
}